

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O3

ConstantValue<long,_(flow::LiteralType)2> * __thiscall
flow::IRProgram::get<flow::ConstantValue<long,(flow::LiteralType)2>,long>
          (IRProgram *this,
          vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
          *table,long *literal)

{
  pointer puVar1;
  __uniq_ptr_impl<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
  _Var2;
  ConstantValue<long,_(flow::LiteralType)2> *this_00;
  long lVar3;
  pointer *__ptr;
  long lVar4;
  _Head_base<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_false> local_48;
  string local_40;
  
  puVar1 = (table->
           super__Vector_base<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(table->
                super__Vector_base<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar3 != 0) {
    lVar4 = 0;
    do {
      _Var2._M_t.
      super__Tuple_impl<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
      .super__Head_base<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_false>._M_head_impl
           = puVar1[lVar4]._M_t.
             super___uniq_ptr_impl<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
             ._M_t;
      if (*(long *)((long)_Var2._M_t.
                          super__Tuple_impl<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
                          .
                          super__Head_base<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_false>
                          ._M_head_impl + 0x48) == *literal) {
        return (ConstantValue<long,_(flow::LiteralType)2> *)
               (_Tuple_impl<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
                )_Var2._M_t.
                 super__Tuple_impl<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
                 .super__Head_base<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_false>.
                 _M_head_impl;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 >> 3 != lVar4);
  }
  this_00 = (ConstantValue<long,_(flow::LiteralType)2> *)operator_new(0x50);
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  Value::Value((Value *)this_00,Number,&local_40);
  (this_00->super_Constant).super_Value._vptr_Value = (_func_int **)&PTR__Value_001b0198;
  this_00->value_ = *literal;
  local_48._M_head_impl = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::unique_ptr<flow::ConstantValue<long,(flow::LiteralType)2>,std::default_delete<flow::ConstantValue<long,(flow::LiteralType)2>>>,std::allocator<std::unique_ptr<flow::ConstantValue<long,(flow::LiteralType)2>,std::default_delete<flow::ConstantValue<long,(flow::LiteralType)2>>>>>
  ::
  emplace_back<std::unique_ptr<flow::ConstantValue<long,(flow::LiteralType)2>,std::default_delete<flow::ConstantValue<long,(flow::LiteralType)2>>>>
            ((vector<std::unique_ptr<flow::ConstantValue<long,(flow::LiteralType)2>,std::default_delete<flow::ConstantValue<long,(flow::LiteralType)2>>>,std::allocator<std::unique_ptr<flow::ConstantValue<long,(flow::LiteralType)2>,std::default_delete<flow::ConstantValue<long,(flow::LiteralType)2>>>>>
              *)table,(unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
                       *)&local_48);
  if (local_48._M_head_impl != (ConstantValue<long,_(flow::LiteralType)2> *)0x0) {
    (*((local_48._M_head_impl)->super_Constant).super_Value._vptr_Value[1])();
  }
  return (table->
         super__Vector_base<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
         .super__Head_base<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_false>.
         _M_head_impl;
}

Assistant:

T* IRProgram::get(std::vector<std::unique_ptr<T>>& table, const U& literal) {
  for (size_t i = 0, e = table.size(); i != e; ++i)
    if (table[i]->get() == literal)
      return table[i].get();

  table.emplace_back(std::make_unique<T>(literal));
  return table.back().get();
}